

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O0

size_t absl::lts_20240722::log_internal::FormatLogPrefix
                 (LogSeverity severity,Time timestamp,Tid tid,string_view basename,int line,
                 PrefixFormat format,Span<char> *buf)

{
  size_t sVar1;
  Time timestamp_00;
  string_view src;
  string_view src_00;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  log_internal *local_78;
  size_t local_70;
  HiRep local_64;
  uint local_5c;
  HiRep local_54;
  uint local_4c;
  size_t local_48;
  size_t prefix_size;
  Tid tid_local;
  LogSeverity severity_local;
  string_view basename_local;
  Time timestamp_local;
  Span<char> *dst;
  
  basename_local._M_len = (size_t)basename._M_str;
  _tid_local = (log_internal *)basename._M_len;
  timestamp_00.rep_.rep_hi_.lo_ = timestamp.rep_.rep_lo_;
  local_64 = timestamp.rep_.rep_hi_;
  timestamp_00.rep_.rep_hi_.hi_ = 0;
  timestamp_00.rep_.rep_lo_ = tid;
  dst = (Span<char> *)(ulong)(uint)tid;
  local_5c = timestamp_00.rep_.rep_hi_.lo_;
  local_54 = local_64;
  local_4c = timestamp_00.rep_.rep_hi_.lo_;
  prefix_size._0_4_ = tid;
  prefix_size._4_4_ = severity;
  unique0x10000092 = local_64;
  local_48 = anon_unknown_3::FormatBoundedFields
                       ((anon_unknown_3 *)(ulong)severity,timestamp.rep_.rep_hi_.lo_,timestamp_00,
                        (Tid)buf,(Span<char> *)basename_local._M_len);
  local_78 = _tid_local;
  local_70 = basename_local._M_len;
  src._M_str = (char *)buf;
  src._M_len = basename_local._M_len;
  sVar1 = AppendTruncated(_tid_local,src,dst);
  local_48 = sVar1 + local_48;
  sVar1 = anon_unknown_3::FormatLineNumber(line,buf);
  local_48 = sVar1 + local_48;
  if (format == kRaw) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"RAW: ");
    src_00._M_str = (char *)buf;
    src_00._M_len = (size_t)local_88._M_str;
    sVar1 = AppendTruncated((log_internal *)local_88._M_len,src_00,dst);
    local_48 = sVar1 + local_48;
  }
  return local_48;
}

Assistant:

size_t FormatLogPrefix(absl::LogSeverity severity, absl::Time timestamp,
                       log_internal::Tid tid, absl::string_view basename,
                       int line, PrefixFormat format, absl::Span<char>& buf) {
  auto prefix_size = FormatBoundedFields(severity, timestamp, tid, buf);
  prefix_size += log_internal::AppendTruncated(basename, buf);
  prefix_size += FormatLineNumber(line, buf);
  if (format == PrefixFormat::kRaw)
    prefix_size += log_internal::AppendTruncated("RAW: ", buf);
  return prefix_size;
}